

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsort.c
# Opt level: O1

void trsort64(saidx64_t *ISA,saidx64_t *SA,saidx64_t n,saidx64_t depth)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  saint_t sVar6;
  ulong *puVar7;
  ulong *first;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  saidx64_t *psVar23;
  ulong *ISAd;
  ulong uVar24;
  saidx64_t sVar25;
  saidx64_t sVar26;
  ulong *puVar27;
  uint uVar28;
  saidx64_t v;
  long lVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong *last;
  uint uVar35;
  ulong uVar36;
  anon_struct_32_5_90aca025_conflict stack [96];
  uint local_cf4;
  ulong *local_ce0;
  long local_cd8;
  long local_cd0;
  long local_cc8;
  ulong *local_cc0;
  ulong *local_cb8;
  saidx64_t local_cb0;
  long local_ca8;
  ulong *local_ca0;
  ulong *local_c98;
  long local_c90;
  ulong *local_c88;
  long local_c80;
  long local_c78 [2];
  ulong *local_c68;
  undefined8 local_c60;
  ulong *local_c58 [2];
  long local_c48;
  long local_c40;
  uint uStack_c3c;
  long local_c38 [3];
  uint auStack_c20 [2];
  undefined8 auStack_c18 [3];
  uint auStack_c00 [756];
  
  if ((ulong)n >> 0x20 == 0) {
    if ((ulong)n < 0x10000) {
      if ((ulong)n < 0x100) {
        sVar6 = lg_table[n];
      }
      else {
        sVar6 = lg_table[(ulong)n >> 8] + 8;
      }
    }
    else if ((ulong)n < 0x1000000) {
      sVar6 = lg_table[(ulong)n >> 0x10] + 0x10;
    }
    else {
      sVar6 = lg_table[(ulong)n >> 0x18] + 0x18;
    }
  }
  else if ((ulong)n < 0x1000000000000) {
    if ((ulong)n >> 0x28 == 0) {
      sVar6 = lg_table[(ulong)n >> 0x20] + 0x20;
    }
    else {
      sVar6 = lg_table[(ulong)n >> 0x28] + 0x28;
    }
  }
  else if ((ulong)n >> 0x38 == 0) {
    sVar6 = lg_table[(ulong)n >> 0x30] + 0x30;
  }
  else {
    sVar6 = lg_table[(ulong)n >> 0x38] + 0x38;
  }
  local_c78[0] = -n;
  lVar21 = *SA;
  if (lVar21 != local_c78[0] && SBORROW8(lVar21,local_c78[0]) == lVar21 + n < 0) {
    puVar27 = (ulong *)(ISA + depth);
    local_ca8 = (long)((sVar6 * 2) / 3);
    psVar23 = SA + 1;
    puVar18 = (ulong *)(SA + n);
    local_c80 = -(long)SA;
    local_c48 = 8 - (long)SA;
    local_cc8 = n;
    local_cc0 = (ulong *)SA;
    local_cb0 = n;
    local_c68 = puVar18;
    local_c60 = psVar23;
    do {
      local_c78[1] = (long)puVar27 - (long)ISA;
      local_cd0 = local_c78[1] >> 3;
      local_c40 = -local_cd0;
      uVar9 = 0;
      local_c90 = 0;
      local_c58[1] = (ulong *)SA;
      local_c88 = puVar27;
      do {
        uVar32 = *local_c58[1];
        if ((long)uVar32 < 0) {
          local_c58[0] = local_c58[1] + -uVar32;
          uVar9 = uVar9 + uVar32;
        }
        else {
          if (uVar9 != 0) {
            local_c58[1][uVar9] = uVar9;
          }
          local_c58[0] = (ulong *)(psVar23 + ISA[uVar32]);
          uVar9 = (long)local_c58[0] - (long)local_c58[1];
          if ((long)uVar9 < 9) {
            uVar9 = -(ulong)(uVar9 == 8);
          }
          else {
            if (uVar9 >> 0x23 == 0) {
              if (uVar9 < 0x80000) {
                if (uVar9 < 0x800) {
                  uVar35 = lg_table[uVar9 >> 3];
                }
                else {
                  uVar35 = lg_table[uVar9 >> 0xb] + 8;
                }
              }
              else if (uVar9 < 0x8000000) {
                uVar35 = lg_table[uVar9 >> 0x13] + 0x10;
              }
              else {
                uVar35 = lg_table[uVar9 >> 0x1b] + 0x18;
              }
            }
            else if (uVar9 >> 0x33 == 0) {
              if (uVar9 >> 0x2b == 0) {
                uVar35 = lg_table[uVar9 >> 0x23] + 0x20;
              }
              else {
                uVar35 = lg_table[uVar9 >> 0x2b] + 0x28;
              }
            }
            else if (uVar9 >> 0x3b == 0) {
              uVar35 = lg_table[uVar9 >> 0x33] + 0x30;
            }
            else {
              uVar35 = lg_table[uVar9 >> 0x3b] + 0x38;
            }
            local_cf4 = 0xffffffff;
            local_cd8 = 0;
            puVar18 = local_c58[1];
            puVar7 = local_c58[0];
            uVar31 = 0;
LAB_00115a55:
            uVar8 = uVar31;
            ISAd = puVar27;
            last = puVar7;
            first = puVar18;
            puVar18 = first;
            local_ca0 = last;
            puVar27 = ISAd;
            uVar31 = uVar8;
            if (-1 < (int)uVar35) {
              uVar9 = (long)last - (long)first;
              uVar32 = (long)uVar9 >> 3;
              if ((long)uVar32 < 9) {
                uVar35 = 0xfffffffd;
                puVar7 = first;
                while (puVar10 = puVar7 + 1, puVar10 < last) {
                  uVar9 = puVar7[1];
                  uVar32 = ISAd[uVar9];
                  uVar13 = ISAd[*puVar7];
                  if ((long)uVar32 < (long)uVar13) {
                    do {
                      do {
                        puVar14 = puVar7;
                        puVar14[1] = *puVar14;
                        puVar7 = puVar14 + -1;
                        if (puVar7 < first) goto LAB_00115afa;
                      } while ((long)*puVar7 < 0);
                      uVar32 = ISAd[uVar9];
                      uVar13 = ISAd[*puVar7];
                    } while ((long)uVar32 < (long)uVar13);
LAB_00115afa:
                    puVar7 = puVar14 + -1;
                  }
                  if (uVar32 == uVar13) {
                    *puVar7 = ~*puVar7;
                  }
                  puVar7[1] = uVar9;
                  puVar7 = puVar10;
                }
                goto LAB_0011646f;
              }
              puVar7 = last + -1;
              if (uVar35 == 0) {
                local_c98 = local_cb8;
                uVar13 = uVar32;
                if ((uVar9 & 8) == 0) {
                  uVar13 = uVar32 - 1;
                  uVar17 = first[uVar32 - 1];
                  if ((long)ISAd[first[uVar13 >> 1]] < (long)ISAd[uVar17]) {
                    first[uVar32 - 1] = first[uVar13 >> 1];
                    first[uVar13 >> 1] = uVar17;
                  }
                }
                if (1 < uVar13) {
                  uVar32 = uVar13 >> 1;
                  do {
                    uVar24 = uVar32 - 1;
                    uVar1 = first[uVar32 - 1];
                    uVar17 = uVar32 * 2 - 1;
                    uVar12 = uVar24;
                    if ((long)uVar17 < (long)uVar13) {
                      uVar20 = ISAd[uVar1];
                      lVar21 = uVar32 * 2 + -2;
                      uVar33 = uVar24;
                      do {
                        uVar2 = ISAd[first[uVar17]];
                        uVar3 = ISAd[first[lVar21 + 2]];
                        uVar36 = uVar3;
                        if ((long)uVar3 < (long)uVar2) {
                          uVar36 = uVar2;
                        }
                        uVar12 = uVar33;
                        if ((long)uVar36 <= (long)uVar20) break;
                        uVar12 = uVar17;
                        if ((long)uVar2 < (long)uVar3) {
                          uVar12 = lVar21 + 2;
                        }
                        first[uVar33] = first[uVar12];
                        lVar21 = uVar12 * 2;
                        uVar17 = uVar12 * 2 + 1;
                        uVar33 = uVar12;
                      } while ((long)uVar17 < (long)uVar13);
                    }
                    first[uVar12] = uVar1;
                    bVar5 = 1 < (long)uVar32;
                    uVar32 = uVar24;
                  } while (bVar5);
                }
                if ((uVar9 & 8) == 0) {
                  uVar9 = *first;
                  *first = first[uVar13];
                  first[uVar13] = uVar9;
                  uVar9 = *first;
                  if ((long)uVar13 < 2) {
                    lVar21 = 0;
                  }
                  else {
                    uVar32 = ISAd[uVar9];
                    lVar19 = 1;
                    lVar22 = 0;
                    lVar34 = 0;
                    do {
                      uVar17 = ISAd[first[lVar19]];
                      uVar1 = ISAd[first[lVar22 + 2]];
                      uVar12 = uVar1;
                      if ((long)uVar1 < (long)uVar17) {
                        uVar12 = uVar17;
                      }
                      lVar21 = lVar34;
                      if ((long)uVar12 <= (long)uVar32) break;
                      lVar21 = lVar19;
                      if ((long)uVar17 < (long)uVar1) {
                        lVar21 = lVar22 + 2;
                      }
                      first[lVar34] = first[lVar21];
                      lVar22 = lVar21 * 2;
                      lVar19 = lVar21 * 2 + 1;
                      lVar34 = lVar21;
                    } while (lVar19 < (long)uVar13);
                  }
                  first[lVar21] = uVar9;
                }
                if (1 < (long)uVar13) {
                  do {
                    uVar17 = uVar13 - 1;
                    uVar9 = *first;
                    uVar32 = first[uVar13 - 1];
                    *first = uVar32;
                    if (uVar13 == 2) {
                      lVar34 = 0;
                    }
                    else {
                      uVar1 = ISAd[uVar32];
                      lVar21 = 1;
                      lVar19 = 0;
                      lVar22 = 0;
                      do {
                        uVar12 = ISAd[first[lVar21]];
                        uVar24 = ISAd[first[lVar19 + 2]];
                        uVar20 = uVar24;
                        if ((long)uVar24 < (long)uVar12) {
                          uVar20 = uVar12;
                        }
                        lVar34 = lVar22;
                        if ((long)uVar20 <= (long)uVar1) break;
                        lVar34 = lVar21;
                        if ((long)uVar12 < (long)uVar24) {
                          lVar34 = lVar19 + 2;
                        }
                        first[lVar22] = first[lVar34];
                        lVar19 = lVar34 * 2;
                        lVar21 = lVar34 * 2 + 1;
                        lVar22 = lVar34;
                      } while (lVar21 < (long)uVar17);
                    }
                    first[lVar34] = uVar32;
                    first[uVar17] = uVar9;
                    bVar5 = 2 < (long)uVar13;
                    uVar13 = uVar17;
                  } while (bVar5);
                }
                uVar35 = 0xfffffffd;
joined_r0x0011640e:
                local_ce0 = puVar7;
                SA = (saidx64_t *)local_cc0;
                if (first < local_ce0) {
                  local_cb8 = local_ce0 + -1;
                  puVar7 = local_cb8;
                  if (first <= local_cb8) {
                    uVar9 = ISAd[*local_ce0];
                    do {
                      puVar7 = local_cb8;
                      if (ISAd[*local_cb8] != uVar9) break;
                      *local_cb8 = ~*local_cb8;
                      local_cb8 = local_cb8 + -1;
                      puVar7 = local_cb8;
                    } while (first <= local_cb8);
                  }
                  goto joined_r0x0011640e;
                }
                goto LAB_0011646f;
              }
              puVar10 = (ulong *)((long)first + (uVar32 & 0xfffffffffffffffe) * 4);
              if ((long)uVar32 < 0x201) {
                if ((long)uVar32 < 0x21) {
                  local_ce0 = puVar10;
                  if ((long)ISAd[*puVar10] < (long)ISAd[*first]) {
                    local_ce0 = first;
                  }
                  if ((long)ISAd[*puVar7] < (long)ISAd[*local_ce0]) {
                    if ((long)ISAd[*first] <= (long)ISAd[*puVar10]) {
                      puVar10 = first;
                    }
                    local_ce0 = puVar7;
                    if ((long)ISAd[*puVar7] < (long)ISAd[*puVar10]) {
                      local_ce0 = puVar10;
                    }
                  }
                }
                else {
                  uVar9 = uVar32 >> 2;
                  puVar14 = first + uVar9;
                  lVar21 = -uVar9;
                  puVar15 = puVar7 + -uVar9;
                  puVar11 = puVar10;
                  if ((long)ISAd[*puVar10] < (long)ISAd[*puVar14]) {
                    puVar11 = puVar14;
                    puVar14 = puVar10;
                  }
                  puVar10 = puVar7;
                  if ((long)ISAd[*puVar7] < (long)ISAd[*puVar15]) {
                    puVar10 = puVar15;
                    lVar21 = 0;
                    puVar15 = puVar7;
                  }
                  puVar16 = puVar10;
                  if ((long)ISAd[puVar7[lVar21]] < (long)ISAd[*puVar14]) {
                    puVar16 = puVar11;
                    puVar11 = puVar10;
                    puVar15 = puVar14;
                  }
                  puVar7 = puVar11;
                  local_ce0 = first;
                  if ((long)ISAd[*puVar11] < (long)ISAd[*first]) {
                    puVar7 = first;
                    local_ce0 = puVar11;
                  }
                  if ((long)ISAd[*local_ce0] <= (long)ISAd[*puVar15]) {
                    local_ce0 = puVar15;
                    puVar16 = puVar7;
                  }
                  if ((long)ISAd[*puVar16] <= (long)ISAd[*local_ce0]) {
                    local_ce0 = puVar16;
                  }
                }
              }
              else {
                local_c98 = (ulong *)CONCAT44(local_c98._4_4_,uVar35);
                uVar9 = uVar32 >> 3;
                puVar14 = (ulong *)((long)first + (uVar32 & 0xfffffffffffffff8));
                puVar15 = puVar14;
                if ((long)ISAd[*(long *)((long)first + (uVar32 & 0xfffffffffffffff8))] <
                    (long)ISAd[*first]) {
                  puVar15 = first;
                }
                if ((long)ISAd[first[uVar9 * 2]] < (long)ISAd[*puVar15]) {
                  if ((long)ISAd[*first] <=
                      (long)ISAd[*(long *)((long)first + (uVar32 & 0xfffffffffffffff8))]) {
                    puVar14 = first;
                  }
                  puVar15 = puVar14;
                  if ((long)ISAd[*puVar14] <= (long)ISAd[first[uVar9 * 2]]) {
                    puVar15 = first + uVar9 * 2;
                  }
                }
                lVar19 = -uVar9;
                puVar11 = puVar10 + -uVar9;
                puVar14 = puVar10;
                lVar21 = 0;
                if ((long)ISAd[*puVar10] < (long)ISAd[*puVar11]) {
                  puVar14 = puVar11;
                  lVar21 = lVar19;
                }
                if ((long)ISAd[puVar10[uVar9]] < (long)ISAd[puVar10[lVar21]]) {
                  if ((long)ISAd[*puVar10] < (long)ISAd[*puVar11]) {
                    puVar11 = puVar10;
                  }
                  puVar14 = puVar11;
                  if ((long)ISAd[*puVar11] <= (long)ISAd[puVar10[uVar9]]) {
                    puVar14 = puVar10 + uVar9;
                  }
                }
                puVar10 = puVar7 + -uVar9;
                puVar11 = puVar10;
                if ((long)ISAd[*puVar10] < (long)ISAd[puVar7[uVar9 * -2]]) {
                  puVar11 = puVar7 + uVar9 * -2;
                  lVar19 = uVar9 * -2;
                }
                if ((long)ISAd[*puVar7] < (long)ISAd[puVar7[lVar19]]) {
                  puVar16 = puVar7 + uVar9 * -2;
                  if ((long)ISAd[*puVar10] < (long)ISAd[puVar7[uVar9 * -2]]) {
                    puVar16 = puVar10;
                  }
                  puVar11 = puVar7;
                  if ((long)ISAd[*puVar7] < (long)ISAd[*puVar16]) {
                    puVar11 = puVar16;
                  }
                }
                local_ce0 = puVar14;
                if ((long)ISAd[*puVar14] < (long)ISAd[*puVar15]) {
                  local_ce0 = puVar15;
                }
                if ((long)ISAd[*puVar11] < (long)ISAd[*local_ce0]) {
                  if ((long)ISAd[*puVar14] < (long)ISAd[*puVar15]) {
                    puVar15 = puVar14;
                  }
                  local_ce0 = puVar11;
                  if ((long)ISAd[*puVar11] < (long)ISAd[*puVar15]) {
                    local_ce0 = puVar15;
                  }
                }
              }
              uVar9 = *first;
              *first = *local_ce0;
              *local_ce0 = uVar9;
              uVar9 = ISAd[*first];
              tr_partition((saidx64_t *)ISAd,(saidx64_t *)first,(saidx64_t *)(first + 1),
                           (saidx64_t *)last,(saidx64_t **)&local_ce0,(saidx64_t **)&local_cb8,uVar9
                          );
              uVar13 = (long)local_cb8 - (long)local_ce0 >> 3;
              SA = (saidx64_t *)local_cc0;
              if (uVar32 != uVar13) {
                uVar30 = 0xffffffff;
                if (ISA[*local_ce0] != uVar9) {
                  if (uVar13 >> 0x20 == 0) {
                    if (uVar13 < 0x10000) {
                      if (uVar13 < 0x100) {
                        uVar30 = lg_table[uVar13];
                      }
                      else {
                        uVar30 = lg_table[uVar13 >> 8] + 8;
                      }
                    }
                    else if (uVar13 < 0x1000000) {
                      uVar30 = lg_table[uVar13 >> 0x10] + 0x10;
                    }
                    else {
                      uVar30 = lg_table[uVar13 >> 0x18] + 0x18;
                    }
                  }
                  else if (uVar13 < 0x1000000000000) {
                    if (uVar13 < 0x10000000000) {
                      uVar30 = lg_table[uVar13 >> 0x20] + 0x20;
                    }
                    else {
                      uVar30 = lg_table[uVar13 >> 0x28] + 0x28;
                    }
                  }
                  else if (uVar13 < 0x100000000000000) {
                    uVar30 = lg_table[uVar13 >> 0x30] + 0x30;
                  }
                  else {
                    uVar30 = lg_table[uVar13 >> 0x38] + 0x38;
                  }
                }
                if (first < local_ce0) {
                  puVar7 = first;
                  do {
                    ISA[*puVar7] = ((long)local_ce0 - (long)local_cc0 >> 3) + -1;
                    puVar7 = puVar7 + 1;
                  } while (puVar7 < local_ce0);
                }
                if ((local_cb8 < local_ca0) && (local_ce0 < local_cb8)) {
                  puVar7 = local_ce0;
                  do {
                    ISA[*puVar7] = ((long)local_cb8 - (long)local_cc0 >> 3) + -1;
                    puVar7 = puVar7 + 1;
                  } while (puVar7 < local_cb8);
                }
                uVar28 = uVar35 - 1;
                uVar35 = uVar28;
                if ((long)uVar13 < 2) {
LAB_00116f5d:
                  if ((8 < (long)local_cb8 - (long)local_ce0) && (-1 < (int)local_cf4)) {
                    auStack_c20[(ulong)local_cf4 * 8] = 0xffffffff;
                  }
                  lVar19 = (long)local_ce0 - (long)first >> 3;
                  lVar21 = (long)local_ca0 - (long)local_cb8 >> 3;
                  if (lVar21 < lVar19) {
                    bVar5 = lVar21 < 2;
                    puVar7 = local_ce0;
                    lVar21 = lVar19;
                    if (bVar5) goto joined_r0x0011704d;
                    lVar21 = (long)(int)uVar8;
                    local_c38[lVar21 * 4] = (long)ISAd;
                    local_c38[lVar21 * 4 + 1] = (long)first;
                    *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_ce0;
                    auStack_c20[lVar21 * 8] = uVar28;
                    auStack_c20[lVar21 * 8 + 1] = local_cf4;
                    first = local_cb8;
LAB_00117028:
                    puVar18 = first;
                    puVar7 = local_ca0;
                    uVar31 = uVar8 + 1;
                  }
                  else {
                    puVar18 = local_cb8;
                    puVar7 = local_ca0;
                    if (1 < lVar19) {
                      lVar21 = (long)(int)uVar8;
                      local_c38[lVar21 * 4] = (long)ISAd;
                      local_c38[lVar21 * 4 + 1] = (long)local_cb8;
                      *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_ca0;
                      auStack_c20[lVar21 * 8] = uVar28;
                      auStack_c20[lVar21 * 8 + 1] = local_cf4;
                      local_ca0 = local_ce0;
                      goto LAB_00117028;
                    }
joined_r0x0011704d:
                    if (lVar21 < 2) goto joined_r0x00117074;
                  }
                  goto LAB_00115a55;
                }
                if (local_cc8 < (long)uVar13) {
                  if (local_ca8 == 0) {
                    local_cd8 = local_cd8 + uVar13;
                    goto LAB_00116f5d;
                  }
                  local_cc8 = local_cc8 + local_cb0;
                  local_ca8 = local_ca8 + -1;
                }
                local_cc8 = local_cc8 - uVar13;
                lVar21 = (long)local_ce0 - (long)first >> 3;
                lVar19 = (long)local_ca0 - (long)local_cb8 >> 3;
                puVar7 = local_cb8;
                uVar35 = uVar30;
                if (lVar19 < lVar21) {
                  if ((long)uVar13 < lVar21) {
                    if ((long)uVar13 < lVar19) {
                      lVar21 = (long)(int)uVar8;
                      local_c38[lVar21 * 4] = (long)ISAd;
                      local_c38[lVar21 * 4 + 1] = (long)first;
                      *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_ce0;
                      auStack_c20[lVar21 * 8] = uVar28;
                      auStack_c20[lVar21 * 8 + 1] = local_cf4;
                      auStack_c18[lVar21 * 4] = ISAd;
                      auStack_c18[lVar21 * 4 + 1] = local_cb8;
                      *(ulong **)(auStack_c00 + lVar21 * 8 + -2) = local_ca0;
                      goto LAB_001162cf;
                    }
                    lVar21 = (long)(int)uVar8;
                    local_c38[lVar21 * 4] = (long)ISAd;
                    local_c38[lVar21 * 4 + 1] = (long)first;
                    *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_ce0;
                    auStack_c20[lVar21 * 8] = uVar28;
                    auStack_c20[lVar21 * 8 + 1] = local_cf4;
                    puVar18 = local_ce0;
                    puVar27 = ISAd + local_cd0;
                    uVar31 = uVar8 + 1;
                    if (lVar19 < 2) goto LAB_00115a55;
                    lVar21 = (long)(int)(uVar8 + 1);
                    local_c38[lVar21 * 4] = (long)(ISAd + local_cd0);
                    local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                    *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_cb8;
                    auStack_c20[lVar21 * 8] = uVar30;
                    auStack_c20[lVar21 * 8 + 1] = local_cf4;
                    first = local_cb8;
                  }
                  else {
                    if (lVar19 < 2) {
                      puVar18 = local_ce0;
                      puVar27 = ISAd + local_cd0;
                      if (1 < lVar21) {
                        lVar21 = (long)(int)uVar8;
                        local_c38[lVar21 * 4] = (long)(ISAd + local_cd0);
                        local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                        *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_cb8;
                        auStack_c20[lVar21 * 8] = uVar30;
                        uVar31 = uVar8 + 1;
LAB_00117597:
                        auStack_c20[lVar21 * 8 + 1] = local_cf4;
                        puVar18 = first;
                        puVar7 = local_ce0;
                        puVar27 = ISAd;
                        uVar35 = uVar28;
                      }
                      goto LAB_00115a55;
                    }
                    lVar21 = (long)(int)uVar8;
                    local_c38[lVar21 * 4] = (long)(ISAd + local_cd0);
                    local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                    *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_cb8;
                    auStack_c20[lVar21 * 8] = uVar30;
                    auStack_c20[lVar21 * 8 + 1] = local_cf4;
                    auStack_c18[lVar21 * 4] = ISAd;
                    auStack_c18[lVar21 * 4 + 1] = first;
                    *(ulong **)(auStack_c00 + lVar21 * 8 + -2) = local_ce0;
                    auStack_c00[lVar21 * 8] = uVar28;
                    auStack_c00[lVar21 * 8 + 1] = local_cf4;
                    first = local_cb8;
                  }
                }
                else {
                  if ((long)uVar13 < lVar19) {
                    if ((long)uVar13 < lVar21) {
                      lVar21 = (long)(int)uVar8;
                      local_c38[lVar21 * 4] = (long)ISAd;
                      local_c38[lVar21 * 4 + 1] = (long)local_cb8;
                      *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_ca0;
                      auStack_c20[lVar21 * 8] = uVar28;
                      auStack_c20[lVar21 * 8 + 1] = local_cf4;
                      auStack_c18[lVar21 * 4] = ISAd;
                      auStack_c18[lVar21 * 4 + 1] = first;
                      *(ulong **)(auStack_c00 + lVar21 * 8 + -2) = local_ce0;
LAB_001162cf:
                      auStack_c00[(long)(int)uVar8 * 8] = uVar28;
                      auStack_c00[(long)(int)uVar8 * 8 + 1] = local_cf4;
                      puVar18 = local_ce0;
                      puVar27 = ISAd + local_cd0;
                      uVar31 = uVar8 + 2;
                    }
                    else {
                      lVar19 = (long)(int)uVar8;
                      local_c38[lVar19 * 4] = (long)ISAd;
                      local_c38[lVar19 * 4 + 1] = (long)local_cb8;
                      *(ulong **)(auStack_c20 + lVar19 * 8 + -2) = local_ca0;
                      auStack_c20[lVar19 * 8] = uVar28;
                      auStack_c20[lVar19 * 8 + 1] = local_cf4;
                      puVar18 = local_ce0;
                      puVar27 = ISAd + local_cd0;
                      uVar31 = uVar8 + 1;
                      if (1 < lVar21) {
                        lVar21 = (long)(int)(uVar8 + 1);
                        local_c38[lVar21 * 4] = (long)(ISAd + local_cd0);
                        local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                        *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_cb8;
                        auStack_c20[lVar21 * 8] = uVar30;
                        uVar31 = uVar8 + 2;
                        goto LAB_00117597;
                      }
                    }
                    goto LAB_00115a55;
                  }
                  if (lVar21 < 2) {
                    puVar18 = local_ce0;
                    puVar27 = ISAd + local_cd0;
                    if (1 < lVar19) {
                      lVar21 = (long)(int)uVar8;
                      local_c38[lVar21 * 4] = (long)(ISAd + local_cd0);
                      local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                      *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_cb8;
                      auStack_c20[lVar21 * 8] = uVar30;
                      auStack_c20[lVar21 * 8 + 1] = local_cf4;
                      puVar18 = local_cb8;
                      puVar7 = local_ca0;
                      puVar27 = ISAd;
                      uVar35 = uVar28;
                      uVar31 = uVar8 + 1;
                    }
                    goto LAB_00115a55;
                  }
                  lVar21 = (long)(int)uVar8;
                  local_c38[lVar21 * 4] = (long)(ISAd + local_cd0);
                  local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                  *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_cb8;
                  auStack_c20[lVar21 * 8] = uVar30;
                  auStack_c20[lVar21 * 8 + 1] = local_cf4;
                  auStack_c18[lVar21 * 4] = ISAd;
                  auStack_c18[lVar21 * 4 + 1] = local_cb8;
                  *(ulong **)(auStack_c00 + lVar21 * 8 + -2) = local_ca0;
                  auStack_c00[lVar21 * 8] = uVar28;
                  auStack_c00[lVar21 * 8 + 1] = local_cf4;
                  local_ca0 = local_ce0;
                }
                puVar18 = first;
                puVar7 = local_ca0;
                puVar27 = ISAd;
                uVar35 = uVar28;
                uVar31 = uVar8 + 2;
                goto LAB_00115a55;
              }
              if (local_cc8 < (long)uVar32) {
                if (local_ca8 != 0) {
                  local_cc8 = local_cc8 + local_cb0;
                  local_ca8 = local_ca8 + -1;
                  goto LAB_001160a3;
                }
                if (-1 < (int)local_cf4) {
                  auStack_c20[(ulong)local_cf4 * 8] = 0xffffffff;
                }
                local_cd8 = local_cd8 + uVar32;
                if (uVar8 == 0) goto LAB_0011762b;
                lVar21 = (long)(int)uVar8;
                uVar35 = *(uint *)(local_c38 + lVar21 * 4 + -1);
                local_cf4 = *(uint *)((long)local_c38 + lVar21 * 0x20 + -4);
                puVar18 = local_c58[lVar21 * 4 + 1];
                puVar7 = (ulong *)(&local_c48)[lVar21 * 4];
                puVar27 = local_c58[lVar21 * 4];
                uVar31 = uVar8 - 1;
              }
              else {
LAB_001160a3:
                if (uVar32 >> 0x20 == 0) {
                  if (uVar32 < 0x10000) {
                    if (uVar32 < 0x100) {
                      uVar35 = lg_table[uVar32];
                    }
                    else {
                      uVar35 = lg_table[uVar32 >> 8] + 8;
                    }
                  }
                  else if (uVar32 < 0x1000000) {
                    uVar35 = lg_table[uVar32 >> 0x10] + 0x10;
                  }
                  else {
                    uVar35 = lg_table[uVar32 >> 0x18] + 0x18;
                  }
                }
                else if (uVar32 < 0x1000000000000) {
                  if (uVar32 < 0x10000000000) {
                    uVar35 = lg_table[uVar32 >> 0x20] + 0x20;
                  }
                  else {
                    uVar35 = lg_table[uVar32 >> 0x28] + 0x28;
                  }
                }
                else if (uVar32 < 0x100000000000000) {
                  uVar35 = lg_table[uVar32 >> 0x30] + 0x30;
                }
                else {
                  uVar35 = lg_table[uVar32 >> 0x38] + 0x38;
                }
                local_cc8 = local_cc8 - uVar32;
                puVar7 = local_ca0;
                puVar27 = ISAd + local_cd0;
              }
              goto LAB_00115a55;
            }
LAB_0011646f:
            if (uVar35 == 0xfffffffe) {
              lVar21 = (long)(int)uVar8;
              local_ce0 = local_c58[lVar21 * 4 + 1];
              local_cb8 = (ulong *)(&local_c48)[lVar21 * 4];
              if ((int)local_c38[lVar21 * 4 + -1] == 0) {
                lVar19 = (long)ISAd - (long)ISA >> 3;
                lVar22 = ((long)local_cb8 - (long)SA >> 3) + -1;
                puVar27 = local_ce0 + -1;
                if (first <= puVar27) {
                  do {
                    uVar9 = *first - lVar19;
                    if ((-1 < (long)uVar9) && (ISA[uVar9] == lVar22)) {
                      puVar27[1] = uVar9;
                      puVar27 = puVar27 + 1;
                      ISA[uVar9] = (long)puVar27 - (long)SA >> 3;
                    }
                    first = first + 1;
                  } while (first <= puVar27);
                }
                puVar18 = local_cb8;
                while (puVar27 + 1 < puVar18) {
                  last = last + -1;
                  uVar9 = *last - lVar19;
                  if ((-1 < (long)uVar9) && (ISA[uVar9] == lVar22)) {
                    puVar18[-1] = uVar9;
                    puVar18 = puVar18 + -1;
                    ISA[uVar9] = (long)puVar18 - (long)SA >> 3;
                  }
                }
              }
              else {
                if (-1 < (int)local_cf4) {
                  auStack_c20[(ulong)local_cf4 * 8] = 0xffffffff;
                }
                lVar19 = (long)ISAd - (long)ISA >> 3;
                lVar22 = ((long)local_cb8 - (long)SA >> 3) + -1;
                puVar27 = local_ce0 + -1;
                sVar25 = -1;
                if (first <= puVar27) {
                  lVar34 = -1;
                  do {
                    uVar9 = *puVar18;
                    uVar32 = uVar9 - lVar19;
                    lVar29 = lVar34;
                    if ((-1 < (long)uVar32) && (ISA[uVar32] == lVar22)) {
                      puVar27[1] = uVar32;
                      puVar27 = puVar27 + 1;
                      lVar29 = ISA[uVar9];
                      if (lVar34 != lVar29) {
                        sVar25 = (long)puVar27 - (long)SA >> 3;
                      }
                      ISA[uVar32] = sVar25;
                    }
                    puVar18 = puVar18 + 1;
                    lVar34 = lVar29;
                  } while (puVar18 <= puVar27);
                }
                if (first <= puVar27) {
                  lVar29 = local_c80 + (long)puVar27;
                  sVar26 = sVar25;
                  lVar34 = -1;
                  puVar18 = puVar27;
                  do {
                    lVar4 = ISA[*puVar18];
                    sVar25 = lVar29 >> 3;
                    if (lVar34 == lVar4) {
                      sVar25 = sVar26;
                    }
                    if (sVar25 != lVar4) {
                      ISA[*puVar18] = sVar25;
                    }
                    puVar18 = puVar18 + -1;
                    lVar29 = lVar29 + -8;
                    sVar26 = sVar25;
                    lVar34 = lVar4;
                  } while (first <= puVar18);
                }
                if (puVar27 + 1 < local_cb8) {
                  puVar18 = local_cb8;
                  lVar34 = -1;
                  do {
                    last = last + -1;
                    uVar9 = *last;
                    uVar32 = uVar9 - lVar19;
                    lVar29 = lVar34;
                    if ((-1 < (long)uVar32) && (ISA[uVar32] == lVar22)) {
                      puVar18[-1] = uVar32;
                      puVar18 = puVar18 + -1;
                      lVar29 = ISA[uVar9];
                      if (lVar34 != lVar29) {
                        sVar25 = (long)puVar18 - (long)SA >> 3;
                      }
                      ISA[uVar32] = sVar25;
                    }
                    lVar34 = lVar29;
                  } while (puVar27 + 1 < puVar18);
                }
              }
              if (uVar8 == 1) goto LAB_0011762b;
              uVar35 = *(uint *)(&local_c60 + lVar21 * 4);
              local_cf4 = *(uint *)((long)&local_c60 + lVar21 * 0x20 + 4);
              puVar18 = (ulong *)local_c78[lVar21 * 4 + 1];
              puVar7 = (&local_c68)[lVar21 * 4];
              puVar27 = (ulong *)local_c78[lVar21 * 4];
              uVar31 = uVar8 - 2;
              goto LAB_00115a55;
            }
            puVar7 = last;
            if (uVar35 == 0xffffffff) {
              puVar10 = ISAd + local_c40;
              tr_partition((saidx64_t *)puVar10,(saidx64_t *)first,(saidx64_t *)first,
                           (saidx64_t *)last,(saidx64_t **)&local_ce0,(saidx64_t **)&local_cb8,
                           ((long)last - (long)SA >> 3) + -1);
              if ((local_ce0 < last) && (first < local_ce0)) {
                puVar14 = first;
                do {
                  ISA[*puVar14] = ((long)local_ce0 - (long)local_cc0 >> 3) + -1;
                  puVar14 = puVar14 + 1;
                } while (puVar14 < local_ce0);
              }
              if ((local_cb8 < last) && (local_ce0 < local_cb8)) {
                puVar14 = local_ce0;
                do {
                  ISA[*puVar14] = ((long)local_cb8 - (long)local_cc0 >> 3) + -1;
                  puVar14 = puVar14 + 1;
                } while (puVar14 < local_cb8);
              }
              if (8 < (long)local_cb8 - (long)local_ce0) {
                lVar21 = (long)(int)uVar8;
                local_c38[lVar21 * 4] = 0;
                local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_cb8;
                (auStack_c20 + lVar21 * 8)[0] = 0;
                (auStack_c20 + lVar21 * 8)[1] = 0;
                auStack_c18[lVar21 * 4] = puVar10;
                auStack_c18[lVar21 * 4 + 1] = first;
                *(ulong **)(auStack_c00 + lVar21 * 8 + -2) = last;
                auStack_c00[lVar21 * 8] = 0xfffffffe;
                auStack_c00[lVar21 * 8 + 1] = local_cf4;
                local_cf4 = uVar8;
                uVar8 = uVar8 + 2;
              }
              uVar9 = (long)local_ce0 - (long)first >> 3;
              uVar32 = (long)last - (long)local_cb8 >> 3;
              SA = (saidx64_t *)local_cc0;
              if ((long)uVar32 < (long)uVar9) {
                if (1 < (long)uVar32) {
                  lVar21 = (long)(int)uVar8;
                  local_c38[lVar21 * 4] = (long)ISAd;
                  local_c38[lVar21 * 4 + 1] = (long)first;
                  *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_ce0;
                  if (uVar9 >> 0x20 == 0) {
                    if (uVar9 < 0x10000) {
                      if (uVar9 < 0x100) {
                        uVar35 = lg_table[uVar9];
                      }
                      else {
                        uVar35 = lg_table[uVar9 >> 8] + 8;
                      }
                    }
                    else if (uVar9 < 0x1000000) {
                      uVar35 = lg_table[uVar9 >> 0x10] + 0x10;
                    }
                    else {
                      uVar35 = lg_table[uVar9 >> 0x18] + 0x18;
                    }
                  }
                  else if (uVar9 < 0x1000000000000) {
                    if (uVar9 < 0x10000000000) {
                      uVar35 = lg_table[uVar9 >> 0x20] + 0x20;
                    }
                    else {
                      uVar35 = lg_table[uVar9 >> 0x28] + 0x28;
                    }
                  }
                  else if (uVar9 < 0x100000000000000) {
                    uVar35 = lg_table[uVar9 >> 0x30] + 0x30;
                  }
                  else {
                    uVar35 = lg_table[uVar9 >> 0x38] + 0x38;
                  }
                  auStack_c20[lVar21 * 8] = uVar35;
                  uVar8 = uVar8 + 1;
                  auStack_c20[lVar21 * 8 + 1] = local_cf4;
LAB_00117125:
                  if (uVar32 >> 0x20 == 0) {
                    if (uVar32 < 0x10000) {
                      if (uVar32 < 0x100) {
                        uVar35 = lg_table[uVar32];
                        puVar18 = local_cb8;
                        uVar31 = uVar8;
                      }
                      else {
                        uVar35 = lg_table[uVar32 >> 8] + 8;
                        puVar18 = local_cb8;
                        uVar31 = uVar8;
                      }
                    }
                    else if (uVar32 < 0x1000000) {
                      uVar35 = lg_table[uVar32 >> 0x10] + 0x10;
                      puVar18 = local_cb8;
                      uVar31 = uVar8;
                    }
                    else {
                      uVar35 = lg_table[uVar32 >> 0x18] + 0x18;
                      puVar18 = local_cb8;
                      uVar31 = uVar8;
                    }
                  }
                  else if (uVar32 < 0x1000000000000) {
                    if (uVar32 < 0x10000000000) {
                      uVar35 = lg_table[uVar32 >> 0x20] + 0x20;
                      puVar18 = local_cb8;
                      uVar31 = uVar8;
                    }
                    else {
                      uVar35 = lg_table[uVar32 >> 0x28] + 0x28;
                      puVar18 = local_cb8;
                      uVar31 = uVar8;
                    }
                  }
                  else if (uVar32 < 0x100000000000000) {
                    uVar35 = lg_table[uVar32 >> 0x30] + 0x30;
                    puVar18 = local_cb8;
                    uVar31 = uVar8;
                  }
                  else {
                    uVar35 = lg_table[uVar32 >> 0x38] + 0x38;
                    puVar18 = local_cb8;
                    uVar31 = uVar8;
                  }
                  goto LAB_00115a55;
                }
                if ((long)uVar9 < 2) {
LAB_00116ab4:
                  if (uVar8 == 0) goto LAB_0011762b;
                  lVar21 = (long)(int)uVar8;
                  local_cf4 = *(uint *)((long)local_c38 + lVar21 * 0x20 + -4);
                  puVar18 = local_c58[lVar21 * 4 + 1];
                  puVar7 = (ulong *)(&local_c48)[lVar21 * 4];
                  puVar27 = local_c58[lVar21 * 4];
                  uVar35 = *(uint *)(local_c38 + lVar21 * 4 + -1);
                  uVar31 = uVar8 - 1;
                  goto LAB_00115a55;
                }
              }
              else {
                if ((long)uVar9 < 2) {
                  if ((long)uVar32 < 2) goto LAB_00116ab4;
                  goto LAB_00117125;
                }
                lVar21 = (long)(int)uVar8;
                local_c38[lVar21 * 4] = (long)ISAd;
                local_c38[lVar21 * 4 + 1] = (long)local_cb8;
                *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = last;
                if (uVar32 >> 0x20 == 0) {
                  if (uVar32 < 0x10000) {
                    if (uVar32 < 0x100) {
                      uVar35 = lg_table[uVar32];
                    }
                    else {
                      uVar35 = lg_table[uVar32 >> 8] + 8;
                    }
                  }
                  else if (uVar32 < 0x1000000) {
                    uVar35 = lg_table[uVar32 >> 0x10] + 0x10;
                  }
                  else {
                    uVar35 = lg_table[uVar32 >> 0x18] + 0x18;
                  }
                }
                else if (uVar32 < 0x1000000000000) {
                  if (uVar32 < 0x10000000000) {
                    uVar35 = lg_table[uVar32 >> 0x20] + 0x20;
                  }
                  else {
                    uVar35 = lg_table[uVar32 >> 0x28] + 0x28;
                  }
                }
                else if (uVar32 < 0x100000000000000) {
                  uVar35 = lg_table[uVar32 >> 0x30] + 0x30;
                }
                else {
                  uVar35 = lg_table[uVar32 >> 0x38] + 0x38;
                }
                auStack_c20[lVar21 * 8] = uVar35;
                uVar8 = uVar8 + 1;
                auStack_c20[lVar21 * 8 + 1] = local_cf4;
              }
              if (uVar9 >> 0x20 == 0) {
                if (uVar9 < 0x10000) {
                  if (uVar9 < 0x100) {
                    uVar35 = lg_table[uVar9];
                    puVar7 = local_ce0;
                    uVar31 = uVar8;
                  }
                  else {
                    uVar35 = lg_table[uVar9 >> 8] + 8;
                    puVar7 = local_ce0;
                    uVar31 = uVar8;
                  }
                }
                else if (uVar9 < 0x1000000) {
                  uVar35 = lg_table[uVar9 >> 0x10] + 0x10;
                  puVar7 = local_ce0;
                  uVar31 = uVar8;
                }
                else {
                  uVar35 = lg_table[uVar9 >> 0x18] + 0x18;
                  puVar7 = local_ce0;
                  uVar31 = uVar8;
                }
              }
              else if (uVar9 < 0x1000000000000) {
                if (uVar9 < 0x10000000000) {
                  uVar35 = lg_table[uVar9 >> 0x20] + 0x20;
                  puVar7 = local_ce0;
                  uVar31 = uVar8;
                }
                else {
                  uVar35 = lg_table[uVar9 >> 0x28] + 0x28;
                  puVar7 = local_ce0;
                  uVar31 = uVar8;
                }
              }
              else if (uVar9 < 0x100000000000000) {
                uVar35 = lg_table[uVar9 >> 0x30] + 0x30;
                puVar7 = local_ce0;
                uVar31 = uVar8;
              }
              else {
                uVar35 = lg_table[uVar9 >> 0x38] + 0x38;
                puVar7 = local_ce0;
                uVar31 = uVar8;
              }
              goto LAB_00115a55;
            }
            if (-1 < (long)*first) {
              lVar21 = local_c80 + (long)first;
              do {
                first = puVar18 + 1;
                ISA[*puVar18] = lVar21 >> 3;
                local_ce0 = first;
                if (last <= first) break;
                lVar21 = lVar21 + 8;
                puVar18 = first;
              } while (-1 < (long)*first);
            }
            if (first < last) {
              lVar21 = 0;
              do {
                lVar22 = lVar21;
                *(ulong *)((long)first + lVar22) = ~*(ulong *)((long)first + lVar22);
                lVar19 = *(long *)((long)first + lVar22 + 8);
                lVar21 = lVar22 + 8;
              } while (lVar19 < 0);
              uVar35 = 0xffffffff;
              if (ISA[lVar19] != ISAd[lVar19]) {
                uVar9 = (lVar21 >> 3) + 1;
                if (uVar9 >> 0x20 == 0) {
                  if (uVar9 < 0x10000) {
                    if (uVar9 < 0x100) {
                      uVar35 = lg_table[(lVar21 >> 3) + 1];
                    }
                    else {
                      uVar35 = lg_table[uVar9 >> 8] + 8;
                    }
                  }
                  else if (uVar9 < 0x1000000) {
                    uVar35 = lg_table[uVar9 >> 0x10] + 0x10;
                  }
                  else {
                    uVar35 = lg_table[uVar9 >> 0x18] + 0x18;
                  }
                }
                else if (uVar9 < 0x1000000000000) {
                  if (uVar9 < 0x10000000000) {
                    uVar35 = lg_table[uVar9 >> 0x20] + 0x20;
                  }
                  else {
                    uVar35 = lg_table[uVar9 >> 0x28] + 0x28;
                  }
                }
                else if (uVar9 < 0x100000000000000) {
                  uVar35 = lg_table[uVar9 >> 0x30] + 0x30;
                }
                else {
                  uVar35 = lg_table[uVar9 >> 0x38] + 0x38;
                }
              }
              local_ce0 = (ulong *)((long)first + lVar22 + 0x10);
              if ((local_ce0 < last) && (local_cb8 = first, first < local_ce0)) {
                do {
                  ISA[*local_cb8] = ((long)first + lVar21 + local_c48 >> 3) + -1;
                  local_cb8 = local_cb8 + 1;
                } while (local_cb8 < local_ce0);
              }
              lVar19 = lVar22 + 0x10 >> 3;
              if (local_cc8 < lVar19) {
                if (local_ca8 == 0) {
                  if (-1 < (int)local_cf4) {
                    auStack_c20[(ulong)local_cf4 * 8] = 0xffffffff;
                  }
                  local_cd8 = local_cd8 + lVar19;
                  puVar18 = local_ce0;
                  uVar35 = 0xfffffffd;
                  if ((long)last + (-lVar21 - (long)first) + -8 < 9) goto joined_r0x00117074;
                  goto LAB_00115a55;
                }
                local_cc8 = local_cc8 + local_cb0;
                local_ca8 = local_ca8 + -1;
              }
              local_cc8 = local_cc8 - lVar19;
              lVar21 = (long)last + (-lVar21 - (long)first) + -8;
              puVar7 = local_ce0;
              if (lVar21 < lVar22 + 0x10) {
                puVar18 = first;
                puVar27 = ISAd + local_cd0;
                if (8 < lVar21) {
                  lVar21 = (long)(int)uVar8;
                  local_c38[lVar21 * 4] = (long)(ISAd + local_cd0);
                  local_c38[lVar21 * 4 + 1] = (long)first;
                  *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = local_ce0;
                  auStack_c20[lVar21 * 8] = uVar35;
                  auStack_c20[lVar21 * 8 + 1] = local_cf4;
                  puVar18 = local_ce0;
                  puVar7 = last;
                  puVar27 = ISAd;
                  uVar35 = 0xfffffffd;
                  uVar31 = uVar8 + 1;
                }
              }
              else {
                lVar21 = (long)(int)uVar8;
                local_c38[lVar21 * 4] = (long)ISAd;
                local_c38[lVar21 * 4 + 1] = (long)local_ce0;
                *(ulong **)(auStack_c20 + lVar21 * 8 + -2) = last;
                auStack_c20[lVar21 * 8] = 0xfffffffd;
                auStack_c20[lVar21 * 8 + 1] = local_cf4;
                puVar18 = first;
                puVar27 = ISAd + local_cd0;
                uVar31 = uVar8 + 1;
              }
              goto LAB_00115a55;
            }
joined_r0x00117074:
            if (uVar8 != 0) {
              lVar21 = (long)(int)uVar8;
              uVar35 = *(uint *)(local_c38 + lVar21 * 4 + -1);
              local_cf4 = *(uint *)((long)local_c38 + lVar21 * 0x20 + -4);
              puVar18 = local_c58[lVar21 * 4 + 1];
              puVar7 = (ulong *)(&local_c48)[lVar21 * 4];
              puVar27 = local_c58[lVar21 * 4];
              uVar31 = uVar8 - 1;
              goto LAB_00115a55;
            }
LAB_0011762b:
            psVar23 = local_c60;
            puVar27 = local_c88;
            puVar18 = local_c68;
            if (local_cd8 == 0) {
              uVar9 = (long)local_c58[1] - (long)local_c58[0] >> 3;
            }
            else {
              local_c90 = local_c90 + local_cd8;
              uVar9 = 0;
            }
          }
        }
        local_c58[1] = local_c58[0];
      } while (local_c58[0] < puVar18);
      if (uVar9 != 0) {
        local_c58[0][uVar9] = uVar9;
      }
    } while ((local_c90 != 0) &&
            (puVar27 = (ulong *)((long)puVar27 + local_c78[1]), local_c78[0] < *SA));
  }
  return;
}

Assistant:

void
trsort(saidx_t *ISA, saidx_t *SA, saidx_t n, saidx_t depth) {
  saidx_t *ISAd;
  saidx_t *first, *last;
  trbudget_t budget;
  saidx_t t, skip, unsorted;

  trbudget_init(&budget, tr_ilg(n) * 2 / 3, n);
/*  trbudget_init(&budget, tr_ilg(n) * 3 / 4, n); */
  for(ISAd = ISA + depth; -n < *SA; ISAd += ISAd - ISA) {
    first = SA;
    skip = 0;
    unsorted = 0;
    do {
      if((t = *first) < 0) { first -= t; skip += t; }
      else {
        if(skip != 0) { *(first + skip) = skip; skip = 0; }
        last = SA + ISA[t] + 1;
        if(1 < (last - first)) {
          budget.count = 0;
          tr_introsort(ISA, ISAd, SA, first, last, &budget);
          if(budget.count != 0) { unsorted += budget.count; }
          else { skip = first - last; }
        } else if((last - first) == 1) {
          skip = -1;
        }
        first = last;
      }
    } while(first < (SA + n));
    if(skip != 0) { *(first + skip) = skip; }
    if(unsorted == 0) { break; }
  }
}